

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TFunction * __thiscall
glslang::TParseContext::findFunction
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TFunction *pTVar4;
  undefined4 extraout_var_02;
  TSymbol *pTVar5;
  undefined4 extraout_var_03;
  byte bVar6;
  TString local_58;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar3 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  bVar2 = TSymbolTable::isFunctionNameVariable(pTVar1,(TString *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  if (bVar2) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t use function syntax on variable",
               (((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                CONCAT44(extraout_var_00,iVar3))->_M_dataplus)._M_p,"");
    return (TFunction *)0x0;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_00,iVar3),"debugPrintfEXT");
  if (iVar3 == 0) {
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "debugPrintfEXT(","");
    pTVar5 = TSymbolTable::find(pTVar1,&local_58,builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar5 != (TSymbol *)0x0) {
      iVar3 = (*pTVar5->_vptr_TSymbol[7])(pTVar5);
      return (TFunction *)CONCAT44(extraout_var_02,iVar3);
    }
  }
  iVar3 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_01,iVar3),"coopMatPerElementNV");
  if (iVar3 == 0) {
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "coopMatPerElementNV(","");
    pTVar5 = TSymbolTable::find(pTVar1,&local_58,builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar5 != (TSymbol *)0x0) {
      iVar3 = (*pTVar5->_vptr_TSymbol[7])(pTVar5);
      return (TFunction *)CONCAT44(extraout_var_03,iVar3);
    }
  }
  iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                    (this,"GL_EXT_shader_explicit_arithmetic_types");
  bVar6 = 1;
  if ((((((char)iVar3 == '\0') &&
        (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                           (this,"GL_EXT_shader_explicit_arithmetic_types_int8"),
        (char)iVar3 == '\0')) &&
       (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int16"),
       (char)iVar3 == '\0')) &&
      ((iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int32"),
       (char)iVar3 == '\0' &&
       (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int64"),
       (char)iVar3 == '\0')))) &&
     ((iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_EXT_shader_explicit_arithmetic_types_float16"),
      (char)iVar3 == '\0' &&
      (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_EXT_shader_explicit_arithmetic_types_float32"),
      (char)iVar3 == '\0')))) {
    iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_explicit_arithmetic_types_float64");
    bVar6 = (byte)iVar3;
  }
  iVar3 = (this->super_TParseContextBase).super_TParseVersions.version;
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    if ((bVar6 & 0x135 < iVar3) == 1) {
LAB_00422750:
      pTVar4 = findFunctionExplicitTypes(this,loc,call,builtIn);
      return pTVar4;
    }
    iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_implicit_conversions");
    if (((char)iVar3 != '\0') &&
       (0x135 < (this->super_TParseContextBase).super_TParseVersions.version)) {
LAB_00422888:
      pTVar4 = findFunction120(this,loc,call,builtIn);
      return pTVar4;
    }
  }
  else if (0x77 < iVar3) {
    if (iVar3 < 400) {
      iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_gpu_shader_fp64");
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                            (this,"GL_ARB_gpu_shader5"), (char)iVar3 == '\0')) goto LAB_00422888;
    }
    else if (bVar6 != 0) goto LAB_00422750;
    pTVar4 = findFunction400(this,loc,call,builtIn);
    return pTVar4;
  }
  pTVar4 = findFunctionExact(this,loc,call,builtIn);
  return pTVar4;
}

Assistant:

const TFunction* TParseContext::findFunction(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    if (symbolTable.isFunctionNameVariable(call.getName())) {
        error(loc, "can't use function syntax on variable", call.getName().c_str(), "");
        return nullptr;
    }

    const TFunction* function = nullptr;

    // debugPrintfEXT has var args and is in the symbol table as "debugPrintfEXT()",
    // mangled to "debugPrintfEXT("
    if (call.getName() == "debugPrintfEXT") {
        TSymbol* symbol = symbolTable.find("debugPrintfEXT(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    // coopMatPerElementNV is variadic. There is some function signature error
    // checking in handleCoopMat2FunctionCall.
    if (call.getName() == "coopMatPerElementNV") {
        TSymbol* symbol = symbolTable.find("coopMatPerElementNV(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    bool explicitTypesEnabled = extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int8) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int16) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int32) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int64) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float16) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float32) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float64);

    if (isEsProfile())
        function = (explicitTypesEnabled && version >= 310)
                   ? findFunctionExplicitTypes(loc, call, builtIn)
                   : ((extensionTurnedOn(E_GL_EXT_shader_implicit_conversions) && version >= 310)
                      ? findFunction120(loc, call, builtIn)
                      : findFunctionExact(loc, call, builtIn));
    else if (version < 120)
        function = findFunctionExact(loc, call, builtIn);
    else if (version < 400) {
        bool needfindFunction400 = extensionTurnedOn(E_GL_ARB_gpu_shader_fp64) || extensionTurnedOn(E_GL_ARB_gpu_shader5);
        function = needfindFunction400 ? findFunction400(loc, call, builtIn) : findFunction120(loc, call, builtIn);
    }
    else if (explicitTypesEnabled)
        function = findFunctionExplicitTypes(loc, call, builtIn);
    else
        function = findFunction400(loc, call, builtIn);

    return function;
}